

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O0

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  uint *puVar4;
  uint *__last;
  uint local_1c;
  uint i;
  vector<unsigned_int> *indices_local;
  cluster_id *this_local;
  
  uVar2 = vector<unsigned_int>::size(indices);
  vector<unsigned_int>::resize(&this->m_cells,uVar2,false);
  local_1c = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size(indices);
    if (uVar2 <= local_1c) break;
    puVar4 = vector<unsigned_int>::operator[](indices,local_1c);
    uVar1 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&this->m_cells,local_1c);
    *puVar4 = uVar1;
    local_1c = local_1c + 1;
  }
  puVar4 = vector<unsigned_int>::begin(&this->m_cells);
  __last = vector<unsigned_int>::end(&this->m_cells);
  std::sort<unsigned_int*>(puVar4,__last);
  puVar4 = vector<unsigned_int>::operator[](&this->m_cells,0);
  uVar2 = vector<unsigned_int>::size(&this->m_cells);
  uVar3 = fast_hash(puVar4,uVar2 << 2);
  this->m_hash = (ulong)uVar3;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices)
            {
                m_cells.resize(indices.size());

                for (uint i = 0; i < indices.size(); i++)
                {
                    m_cells[i] = static_cast<uint32>(indices[i]);
                }

                std::sort(m_cells.begin(), m_cells.end());

                m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
            }